

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

Type Fixpp::
     get<Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
               (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                *message)

{
  bool bVar1;
  Type TVar2;
  runtime_error *this;
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *this_00;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *message_local;
  
  bVar1 = std::bitset<32UL>::test
                    (&(message->
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                      ).allBits,0);
  if (!bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Bad tag access: tag is not present in message");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = meta::
            get<0ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<270u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<271u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<272u,Fixpp::Type::UTCDate>>,Fixpp::FieldRef<Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>>,Fixpp::FieldRef<Fixpp::TagT<274u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<275u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<625u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<276u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<277u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<282u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<283u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<284u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<286u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<59u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<432u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>>,Fixpp::FieldRef<Fixpp::TagT<110u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<18u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<287u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<37u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<299u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<288u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<289u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<346u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<546u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<811u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
                      ((tuple<Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                        *)message);
  TVar2 = FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>::get(this_00);
  return TVar2;
}

Assistant:

decltype(auto)
    get(const Message& message)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        static_assert(Index::Valid, "Invalid tag for given message");

        if (!message.allBits.test(static_cast<size_t>(Index::Value)))
            throw std::runtime_error("Bad tag access: tag is not present in message");

        return meta::get<Index::Value>(message.values).get();
    }